

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

FuncDef * sqlite3FunctionSearch(int h,char *zFunc)

{
  int iVar1;
  FuncDef *local_28;
  FuncDef *p;
  char *zFunc_local;
  int h_local;
  
  local_28 = sqlite3BuiltinFunctions.a[h];
  while( true ) {
    if (local_28 == (FuncDef *)0x0) {
      return (FuncDef *)0x0;
    }
    iVar1 = sqlite3StrICmp(local_28->zName,zFunc);
    if (iVar1 == 0) break;
    local_28 = (local_28->u).pHash;
  }
  return local_28;
}

Assistant:

SQLITE_PRIVATE FuncDef *sqlite3FunctionSearch(
  int h,               /* Hash of the name */
  const char *zFunc    /* Name of function */
){
  FuncDef *p;
  for(p=sqlite3BuiltinFunctions.a[h]; p; p=p->u.pHash){
    if( sqlite3StrICmp(p->zName, zFunc)==0 ){
      return p;
    }
  }
  return 0;
}